

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_unsubscribe(subscription_s *s)

{
  fio_lock_i *pfVar1;
  uintptr_t *puVar2;
  size_t *psVar3;
  channel_s *pcVar4;
  subscription_s *psVar5;
  fio_ls_embd_s *pfVar6;
  anon_struct_264_5_f7cd9697 *set;
  channel_s *__ptr;
  fio_ch_set__ordered_s_ *pfVar7;
  fio_str_info_s ch;
  fio_str_info_s data;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [24];
  uint64_t hash_value;
  fio_ch_set__map_s_ *pfVar11;
  uintptr_t uVar12;
  fio_msg_internal_s *m_;
  fio_ch_set__ordered_s_ *pfVar13;
  fio_engine_set__ordered_s_ *pfVar14;
  uint32_t type;
  fio_engine_set__ordered_s_ *pfVar15;
  fio_lock_i ret;
  fio_lock_i ret_6;
  uint in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  fio_lock_i fVar16;
  undefined7 in_stack_ffffffffffffffa9;
  char *in_stack_ffffffffffffffb0;
  
  if (s != (subscription_s *)0x0) {
    LOCK();
    fVar16 = s->unsubscribed;
    s->unsubscribed = '\x01';
    UNLOCK();
    if (fVar16 == '\0') {
      LOCK();
      fVar16 = s->lock;
      s->lock = '\x01';
      UNLOCK();
      if (fVar16 != '\0') {
        do {
          in_stack_ffffffffffffffa9 = 0;
          in_stack_ffffffffffffffb0 = &DAT_00000001;
          nanosleep((timespec *)&stack0xffffffffffffffa8,(timespec *)0x0);
          LOCK();
          fVar16 = s->lock;
          s->lock = '\x01';
          UNLOCK();
        } while (fVar16 != '\0');
      }
      pcVar4 = s->parent;
      LOCK();
      fVar16 = pcVar4->lock;
      pcVar4->lock = '\x01';
      UNLOCK();
      if (fVar16 != '\0') {
        do {
          in_stack_ffffffffffffffa9 = 0;
          in_stack_ffffffffffffffb0 = &DAT_00000001;
          nanosleep((timespec *)&stack0xffffffffffffffa8,(timespec *)0x0);
          LOCK();
          fVar16 = pcVar4->lock;
          pcVar4->lock = '\x01';
          UNLOCK();
        } while (fVar16 != '\0');
      }
      psVar5 = (subscription_s *)(s->node).next;
      if (psVar5 != s && psVar5 != (subscription_s *)0x0) {
        pfVar6 = (s->node).prev;
        (psVar5->node).prev = pfVar6;
        pfVar6->next = (fio_ls_embd_s *)psVar5;
        (s->node).next = &s->node;
        (s->node).prev = &s->node;
      }
      if ((pcVar4->subscriptions).next == &pcVar4->subscriptions) {
        set = (anon_struct_264_5_f7cd9697 *)pcVar4->parent;
        hash_value = fio_siphash_xy(pcVar4->name,pcVar4->name_len,1,3,0x18cb68,0x18cb68);
        LOCK();
        pfVar1 = &(set->filters).lock;
        fVar16 = *pfVar1;
        *pfVar1 = '\x01';
        UNLOCK();
        if (fVar16 != '\0') {
          do {
            in_stack_ffffffffffffffa9 = 0;
            in_stack_ffffffffffffffb0 = &DAT_00000001;
            nanosleep((timespec *)&stack0xffffffffffffffa8,(timespec *)0x0);
            LOCK();
            pfVar1 = &(set->filters).lock;
            fVar16 = *pfVar1;
            *pfVar1 = '\x01';
            UNLOCK();
          } while (fVar16 != '\0');
        }
        if ((pcVar4->subscriptions).next == &pcVar4->subscriptions) {
          if (((hash_value != 0) &&
              (pfVar11 = fio_ch_set__find_map_pos_((fio_ch_set_s *)set,hash_value,pcVar4),
              pfVar11 != (fio_ch_set__map_s_ *)0x0)) &&
             (pfVar11->pos != (fio_ch_set__ordered_s_ *)0x0)) {
            __ptr = pfVar11->pos->obj;
            if (__ptr != (channel_s *)0x0) {
              LOCK();
              psVar3 = &__ptr->ref;
              *psVar3 = *psVar3 - 1;
              UNLOCK();
              if (*psVar3 == 0) {
                free(__ptr);
              }
            }
            (set->filters).channels.count = (set->filters).channels.count - 1;
            pfVar7 = pfVar11->pos;
            pfVar7->hash = 0;
            uVar12 = (set->filters).channels.pos;
            pfVar13 = (set->filters).channels.ordered;
            if (pfVar7 == pfVar13 + (uVar12 - 1)) {
              pfVar11->hash = 0;
              pfVar13 = pfVar13 + (uVar12 - 2);
              do {
                uVar12 = uVar12 - 1;
                if (uVar12 == 0) break;
                puVar2 = &pfVar13->hash;
                pfVar13 = pfVar13 + -1;
              } while (*puVar2 == 0);
              (set->filters).channels.pos = uVar12;
            }
            pfVar11->pos = (fio_ch_set__ordered_s_ *)0x0;
          }
          LOCK();
          (set->filters).lock = '\0';
          UNLOCK();
          LOCK();
          pcVar4->lock = '\0';
          UNLOCK();
          if (set != &fio_postoffice) {
            LOCK();
            UNLOCK();
            fVar16 = fio_postoffice.engines.lock;
            if (fio_postoffice.engines.lock != '\0') {
              do {
                fio_postoffice.engines.lock = '\x01';
                in_stack_ffffffffffffffa9 = 0;
                in_stack_ffffffffffffffb0 = &DAT_00000001;
                nanosleep((timespec *)&stack0xffffffffffffffa8,(timespec *)0x0);
                LOCK();
                UNLOCK();
                fVar16 = fio_postoffice.engines.lock;
              } while (fio_postoffice.engines.lock != '\0');
            }
            fio_postoffice.engines.lock = '\x01';
            if ((fio_postoffice.engines.set.ordered != (fio_engine_set__ordered_s_ *)0x0) &&
               (uVar12 = fio_postoffice.engines.set.pos,
               pfVar14 = fio_postoffice.engines.set.ordered,
               pfVar15 = fio_postoffice.engines.set.ordered,
               0 < (long)fio_postoffice.engines.set.pos)) {
              do {
                if (pfVar15->hash != 0) {
                  fVar16 = '\0';
                  in_stack_ffffffffffffffa9 = 0;
                  in_stack_ffffffffffffffb0 = (char *)pcVar4->name_len;
                  in_stack_ffffffffffffff98 = pcVar4->name;
                  uVar8 = pcVar4->name_len;
                  uVar9 = pcVar4->name;
                  auVar10._8_8_ = uVar9;
                  auVar10._0_8_ = uVar8;
                  in_stack_ffffffffffffff8c = 0;
                  in_stack_ffffffffffffff94 = (undefined4)((ulong)in_stack_ffffffffffffffb0 >> 0x20)
                  ;
                  auVar10._16_8_ = 0;
                  (*pfVar15->obj->unsubscribe)
                            (pfVar15->obj,(fio_str_info_s)(auVar10 << 0x40),pcVar4->match);
                  uVar12 = fio_postoffice.engines.set.pos;
                  pfVar14 = fio_postoffice.engines.set.ordered;
                }
                pfVar15 = pfVar15 + 1;
              } while (pfVar15 < pfVar14 + uVar12);
            }
            LOCK();
            fio_postoffice.engines.lock = '\0';
            UNLOCK();
            if (((fio_data->is_worker != '\0') && (fio_data->workers != 1)) &&
               (cluster_data.uuid != 0)) {
              if (pcVar4->match == (fio_match_fn)0x0) {
                type = 5;
              }
              else {
                type = 7;
              }
              ch.len._0_4_ = 1;
              ch.capa = (ulong)in_stack_ffffffffffffff8c << 0x20;
              ch.len._4_4_ = in_stack_ffffffffffffff94;
              ch.data = in_stack_ffffffffffffff98;
              data.len._0_1_ = fVar16;
              data.capa = in_stack_ffffffffffffffa0;
              data.len._1_7_ = in_stack_ffffffffffffffa9;
              data.data = in_stack_ffffffffffffffb0;
              m_ = fio_msg_internal_create
                             (0,type,ch,data,(int8_t)pcVar4->name_len,(int8_t)pcVar4->name);
              fio_cluster_client_sender(m_,-1);
            }
          }
        }
        else {
          LOCK();
          (set->filters).lock = '\0';
          UNLOCK();
          LOCK();
          pcVar4->lock = '\0';
          UNLOCK();
        }
      }
      else {
        LOCK();
        pcVar4->lock = '\0';
        UNLOCK();
      }
      s->on_message = (_func_void_fio_msg_s_ptr *)0x0;
      LOCK();
      s->lock = '\0';
      UNLOCK();
    }
    LOCK();
    puVar2 = &s->ref;
    *puVar2 = *puVar2 - 1;
    UNLOCK();
    if (*puVar2 == 0) {
      if (s->on_unsubscribe != (_func_void_void_ptr_void_ptr *)0x0) {
        (*s->on_unsubscribe)(s->udata1,s->udata2);
      }
      pcVar4 = s->parent;
      if (pcVar4 != (channel_s *)0x0) {
        LOCK();
        psVar3 = &pcVar4->ref;
        *psVar3 = *psVar3 - 1;
        UNLOCK();
        if (*psVar3 == 0) {
          free(pcVar4);
        }
      }
      fio_free(s);
    }
  }
  return;
}

Assistant:

void fio_unsubscribe(subscription_s *s) {
  if (!s)
    return;
  if (fio_trylock(&s->unsubscribed))
    goto finish;
  fio_lock(&s->lock);
  channel_s *ch = s->parent;
  uint8_t removed = 0;
  fio_lock(&ch->lock);
  fio_ls_embd_remove(&s->node);
  /* check if channel is done for */
  if (fio_ls_embd_is_empty(&ch->subscriptions)) {
    fio_collection_s *c = ch->parent;
    uint64_t hashed = FIO_HASH_FN(
        ch->name, ch->name_len, &fio_postoffice.pubsub, &fio_postoffice.pubsub);
    /* lock collection */
    fio_lock(&c->lock);
    /* test again within lock */
    if (fio_ls_embd_is_empty(&ch->subscriptions)) {
      fio_ch_set_remove(&c->channels, hashed, ch, NULL);
      removed = (c != &fio_postoffice.filters);
    }
    fio_unlock(&c->lock);
  }
  fio_unlock(&ch->lock);
  if (removed) {
    fio_pubsub_on_channel_destroy(ch);
  }

  /* promise the subscription will be inactive */
  s->on_message = NULL;
  fio_unlock(&s->lock);
finish:
  fio_subscription_free(s);
}